

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O3

void __thiscall cmCursesMainForm::UpdateStatusBar(cmCursesMainForm *this,char *message)

{
  cmState *pcVar1;
  ulong *__src;
  uint uVar2;
  FIELD *field;
  long *plVar3;
  ulong *__s;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  char fmt_s [3];
  char help [128];
  char bar [512];
  char vertmp [128];
  char version [512];
  undefined2 local_54c;
  undefined1 local_54a;
  ulong *local_548;
  ulong local_540;
  ulong local_538 [16];
  string local_4b8;
  char acStack_498 [33];
  undefined1 auStack_477 [447];
  allocator local_2b8 [128];
  string local_238 [2];
  undefined1 auStack_1f7 [455];
  
  if ((_stdscr == 0) || (*(short *)(_stdscr + 6) < 0x40)) {
LAB_002273b5:
    erase();
    clearok(_stdscr,1);
    move(0,0);
    builtin_strncpy(acStack_498 + 0x10," required.",0xb);
    builtin_strncpy(acStack_498,"t least %dx%d is",0x10);
    local_4b8.field_2._M_local_buf[0] = 'a';
    local_4b8.field_2._M_local_buf[1] = 'l';
    local_4b8.field_2._M_local_buf[2] = 'l';
    local_4b8.field_2._M_local_buf[3] = '.';
    local_4b8.field_2._M_local_buf[4] = ' ';
    local_4b8.field_2._M_local_buf[5] = 'A';
    local_4b8.field_2._M_local_buf[6] = ' ';
    local_4b8.field_2._M_local_buf[7] = 's';
    local_4b8.field_2._M_local_buf[8] = 'i';
    local_4b8.field_2._M_local_buf[9] = 'z';
    local_4b8.field_2._M_local_buf[10] = 'e';
    local_4b8.field_2._M_local_buf[0xb] = ' ';
    local_4b8.field_2._M_local_buf[0xc] = 'o';
    local_4b8.field_2._M_local_buf[0xd] = 'f';
    local_4b8.field_2._M_local_buf[0xe] = ' ';
    local_4b8.field_2._M_local_buf[0xf] = 'a';
    local_4b8._M_dataplus._M_p._0_1_ = 'W';
    local_4b8._M_dataplus._M_p._1_1_ = 'i';
    local_4b8._M_dataplus._M_p._2_1_ = 'n';
    local_4b8._M_dataplus._M_p._3_1_ = 'd';
    local_4b8._M_dataplus._M_p._4_1_ = 'o';
    local_4b8._M_dataplus._M_p._5_1_ = 'w';
    local_4b8._M_dataplus._M_p._6_1_ = ' ';
    local_4b8._M_dataplus._M_p._7_1_ = 'i';
    local_4b8._M_string_length._0_1_ = 's';
    local_4b8._M_string_length._1_1_ = ' ';
    local_4b8._M_string_length._2_1_ = 't';
    local_4b8._M_string_length._3_1_ = 'o';
    local_4b8._M_string_length._4_1_ = 'o';
    local_4b8._M_string_length._5_1_ = ' ';
    local_4b8._M_string_length._6_1_ = 's';
    local_4b8._M_string_length._7_1_ = 'm';
    iVar8 = 0x41;
    if (0x41 < this->InitialWidth) {
      iVar8 = this->InitialWidth;
    }
    printw(&local_4b8,iVar8,6);
    if (_stdscr == 0) {
      iVar8 = -1;
    }
    else {
      iVar8 = *(short *)(_stdscr + 4) + 1;
    }
    wtouchln(_stdscr,0,iVar8,1);
    wrefresh(_stdscr);
    return;
  }
  uVar11 = (ulong)(uint)(int)*(short *)(_stdscr + 4);
  uVar10 = (int)*(short *)(_stdscr + 6) + 1;
  if (*(short *)(_stdscr + 4) < 5 || (int)uVar10 < this->InitialWidth) goto LAB_002273b5;
  local_548 = (ulong *)message;
  field = current_field((this->super_cmCursesForm).Form);
  uVar2 = field_index(field);
  local_540 = uVar11;
  if ((int)uVar2 < 0) {
LAB_0022762c:
    local_538[0xf] = 0;
    local_538[0xe] = 0;
    local_538[0xd] = 0;
    local_538[0xc] = 0;
    local_538[0xb] = 0;
    local_538[10] = 0;
    local_538[9] = 0;
    local_538[8] = 0;
    local_538[7] = 0;
    local_538[6] = 0;
    local_538[5] = 0;
    local_538[4] = 0;
    local_538[3] = 0;
    local_538[2] = 0;
    local_538[1] = 0;
    local_538[0] = 0;
    __s = (ulong *)0x50caef;
  }
  else {
    plVar3 = (long *)field_userptr(this->Fields[(ulong)uVar2 - 2]);
    local_538[0xe] = 0;
    local_538[0xf] = 0;
    local_538[0xc] = 0;
    local_538[0xd] = 0;
    local_538[10] = 0;
    local_538[0xb] = 0;
    local_538[8] = 0;
    local_538[9] = 0;
    local_538[6] = 0;
    local_538[7] = 0;
    local_538[4] = 0;
    local_538[5] = 0;
    local_538[2] = 0;
    local_538[3] = 0;
    local_538[0] = 0;
    local_538[1] = 0;
    if (plVar3 == (long *)0x0) goto LAB_0022762c;
    __s = (ulong *)(**(code **)(*plVar3 + 0x28))(plVar3);
    pcVar1 = this->CMakeInstance->State;
    std::__cxx11::string::string((string *)&local_4b8,(char *)__s,(allocator *)local_238);
    pcVar4 = cmState::GetCacheEntryValue(pcVar1,&local_4b8);
    if ((void *)CONCAT44(local_4b8._M_dataplus._M_p._4_4_,local_4b8._M_dataplus._M_p._0_4_) !=
        (void *)((long)&local_4b8 + 0x10)) {
      operator_delete((void *)CONCAT44(local_4b8._M_dataplus._M_p._4_4_,
                                       local_4b8._M_dataplus._M_p._0_4_),
                      local_4b8.field_2._M_allocated_capacity + 1);
    }
    if (pcVar4 == (char *)0x0) {
      local_538[0] = CONCAT62(local_538[0]._2_6_,0x20);
    }
    else {
      pcVar1 = this->CMakeInstance->State;
      std::__cxx11::string::string((string *)&local_4b8,(char *)__s,local_2b8);
      local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"HELPSTRING","");
      pcVar4 = cmState::GetCacheEntryProperty(pcVar1,&local_4b8,local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
        operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((void *)CONCAT44(local_4b8._M_dataplus._M_p._4_4_,local_4b8._M_dataplus._M_p._0_4_) !=
          (void *)((long)&local_4b8 + 0x10)) {
        operator_delete((void *)CONCAT44(local_4b8._M_dataplus._M_p._4_4_,
                                         local_4b8._M_dataplus._M_p._0_4_),
                        local_4b8.field_2._M_allocated_capacity + 1);
      }
      if (pcVar4 == (char *)0x0) {
        local_538[0] = local_538[0] & 0xffffffffffffff00;
      }
      else {
        strncpy((char *)local_538,pcVar4,0x7f);
        local_538[0xf] = local_538[0xf] & 0xffffffffffffff;
      }
    }
  }
  sVar5 = strlen((char *)__s);
  sVar6 = strlen((char *)local_538);
  __src = local_548;
  uVar2 = 0x200;
  if (uVar10 < 0x200) {
    uVar2 = uVar10;
  }
  uVar11 = (ulong)uVar2;
  if (local_548 == (ulong *)0x0) {
    if (uVar11 <= sVar5) goto LAB_00227720;
    strcpy((char *)&local_4b8,(char *)__s);
    *(undefined2 *)((long)&local_4b8 + sVar5) = 0x203a;
    sVar7 = sVar6 + sVar5 + 2;
    pcVar4 = (char *)((long)&local_4b8 + sVar5 + 2);
    if (sVar7 < uVar11) {
      strcpy(pcVar4,(char *)local_538);
      sVar5 = (uVar11 - (sVar5 + sVar6)) - 2;
      goto LAB_00227719;
    }
    uVar9 = (uVar11 - sVar5) - 2;
    __s = local_538;
  }
  else {
    sVar7 = strlen((char *)local_548);
    sVar5 = uVar11 - sVar7;
    __s = __src;
    if (sVar7 <= uVar11 && sVar5 != 0) {
      strcpy((char *)&local_4b8,(char *)__src);
LAB_00227719:
      memset((undefined1 *)((long)&local_4b8 + sVar7),0x20,sVar5);
      goto LAB_00227733;
    }
LAB_00227720:
    pcVar4 = (char *)&local_4b8;
    uVar9 = uVar11;
  }
  strncpy(pcVar4,(char *)__s,uVar9);
LAB_00227733:
  *(undefined1 *)((long)&local_4b8 + uVar11) = 0;
  pcVar4 = cmVersion::GetCMakeVersion();
  sprintf((char *)local_2b8,"CMake Version %s",pcVar4);
  sVar5 = strlen((char *)local_2b8);
  uVar9 = local_540;
  sVar5 = uVar11 - sVar5;
  if (sVar5 != 0) {
    memset(local_238,0x20,sVar5);
  }
  strcpy((char *)((long)local_238 + sVar5),(char *)local_2b8);
  *(undefined1 *)((long)&local_238[0]._M_dataplus._M_p + uVar11) = 0;
  local_54a = 0;
  local_54c = 0x7325;
  move((int)uVar9 + -4,0);
  wattr_on(_stdscr,0x10000,0);
  printw(&local_54c,&local_4b8);
  wattr_off(_stdscr,0x10000,0);
  move((int)uVar9 + -3,0);
  printw(&local_54c,local_238);
  pos_form_cursor((this->super_cmCursesForm).Form);
  return;
}

Assistant:

void cmCursesMainForm::UpdateStatusBar(const char* message)
{
  int x,y;
  getmaxyx(stdscr, y, x);
  // If window size is too small, display error and return
  if ( x < cmCursesMainForm::MIN_WIDTH  ||
       x < this->InitialWidth               ||
       y < cmCursesMainForm::MIN_HEIGHT )
    {
    curses_clear();
    curses_move(0,0);
    char fmt[] = "Window is too small. A size of at least %dx%d is required.";
    printw(fmt,
           (cmCursesMainForm::MIN_WIDTH < this->InitialWidth ?
            this->InitialWidth : cmCursesMainForm::MIN_WIDTH),
           cmCursesMainForm::MIN_HEIGHT);
    touchwin(stdscr);
    wrefresh(stdscr);
    return;
    }

  // Get the key of the current entry
  FIELD* cur = current_field(this->Form);
  int findex = field_index(cur);
  cmCursesWidget* lbl = 0;
  if ( findex >= 0 )
    {
    lbl = reinterpret_cast<cmCursesWidget*>(field_userptr(this->Fields[findex-2]));
    }
  char help[128] = "";
  const char* curField = "";
  if ( lbl )
    {
    curField = lbl->GetValue();

    // Get the help string of the current entry
    // and add it to the help string
    const char* existingValue =
        this->CMakeInstance->GetState()->GetCacheEntryValue(curField);
    if (existingValue)
      {
      const char* hs = this->CMakeInstance->GetState()
                           ->GetCacheEntryProperty(curField, "HELPSTRING");
      if ( hs )
        {
        strncpy(help, hs, 127);
        help[127] = '\0';
        }
      else
        {
        help[0] = 0;
        }
      }
    else
      {
      sprintf(help," ");
      }
    }

  // Join the key, help string and pad with spaces
  // (or truncate) as necessary
  char bar[cmCursesMainForm::MAX_WIDTH];
  size_t i, curFieldLen = strlen(curField);
  size_t helpLen = strlen(help);

  size_t width;
  if (x < cmCursesMainForm::MAX_WIDTH )
    {
    width = x;
    }
  else
    {
    width = cmCursesMainForm::MAX_WIDTH;
    }

  if ( message )
    {
    curField = message;
    curFieldLen = strlen(message);
    if ( curFieldLen < width )
      {
      strcpy(bar, curField);
      for(i=curFieldLen; i < width; ++i)
        {
        bar[i] = ' ';
        }
      }
    else
      {
      strncpy(bar, curField, width);
      }
   }
  else
    {
    if (curFieldLen >= width)
      {
      strncpy(bar, curField, width);
      }
    else
      {
      strcpy(bar, curField);
      bar[curFieldLen] = ':';
      bar[curFieldLen+1] = ' ';
      if (curFieldLen + helpLen + 2 >= width)
        {
        strncpy(bar+curFieldLen+2, help, width
                - curFieldLen - 2);
        }
      else
        {
        strcpy(bar+curFieldLen+2, help);
        for(i=curFieldLen+helpLen+2; i < width; ++i)
          {
          bar[i] = ' ';
          }
        }
      }
    }


  bar[width] = '\0';


  // Display CMake version info on the next line
  // We want to display this on the right
  char version[cmCursesMainForm::MAX_WIDTH];
  char vertmp[128];
  sprintf(vertmp,"CMake Version %s", cmVersion::GetCMakeVersion());
  size_t sideSpace = (width-strlen(vertmp));
  for(i=0; i<sideSpace; i++) { version[i] = ' '; }
  sprintf(version+sideSpace, "%s", vertmp);
  version[width] = '\0';

  // Now print both lines
  char fmt_s[] = "%s";
  curses_move(y-5,0);
  attron(A_STANDOUT);
  printw(fmt_s, bar);
  attroff(A_STANDOUT);
  curses_move(y-4,0);
  printw(fmt_s, version);
  pos_form_cursor(this->Form);
}